

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_device_main_loop__pulse(ma_device *pDevice)

{
  ma_uint32 mVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ma_result mVar5;
  ma_device_type mVar6;
  uint uVar7;
  ma_result mVar8;
  ma_pa_operation *pOP;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ma_uint64 capturedClientFramesToProcessThisIteration;
  ma_uint32 capturedDeviceFramesToProcess;
  ma_uint64 capturedDeviceFramesToProcessThisIteration;
  ma_uint8 playbackClientData [4096];
  ma_uint8 playbackDeviceData [4096];
  ma_uint8 capturedDeviceData [4096];
  ma_uint8 capturedClientData [4096];
  int local_4084;
  ulong local_4078;
  int local_4070;
  uint local_406c;
  ulong local_4068;
  ulong local_4060;
  uint local_4054;
  ma_data_converter *local_4050;
  ulong local_4048;
  ma_data_converter *local_4040;
  undefined1 local_4038 [4096];
  ma_uint32 local_3038 [1024];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [4104];
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4eab,"ma_result ma_device_main_loop__pulse(ma_device *)");
  }
  mVar6 = pDevice->type;
  if ((mVar6 & ~ma_device_type_playback) == ma_device_type_capture) {
    mVar5 = ma_device__cork_stream__pulse(pDevice,ma_device_type_capture,0);
    if (mVar5 != 0) {
      return mVar5;
    }
    mVar6 = pDevice->type;
  }
  if (((mVar6 | ma_device_type_capture) != ma_device_type_duplex) ||
     (mVar5 = ma_device__cork_stream__pulse(pDevice,ma_device_type_playback,0), mVar5 == 0)) {
    mVar5 = 0;
    if (pDevice->state == 2) {
      local_4040 = &(pDevice->capture).converter;
      local_4050 = &(pDevice->playback).converter;
      mVar5 = 0;
LAB_0010dcf6:
      mVar6 = pDevice->type;
      if (mVar6 == ma_device_type_playback) {
        uVar12 = (pDevice->playback).internalPeriodSizeInFrames;
        iVar2 = (&DAT_001158a0)[(pDevice->playback).internalFormat];
        mVar1 = (pDevice->playback).internalChannels;
        iVar11 = 0;
        if (uVar12 != 0) {
          uVar10 = 0;
          do {
            uVar7 = (uint)(0x1000 / (ulong)(iVar2 * mVar1));
            uVar9 = uVar12 - uVar10;
            if (uVar7 <= uVar12 - uVar10) {
              uVar9 = uVar7;
            }
            ma_device__read_frames_from_client(pDevice,uVar9,local_2038);
            mVar5 = ma_device_write__pulse(pDevice,local_2038,uVar9,local_3038);
            if (mVar5 != 0) goto LAB_0010e07d;
            uVar10 = uVar10 + local_3038[0];
          } while (uVar10 < uVar12);
LAB_0010e072:
          iVar11 = 0;
          mVar5 = 0;
        }
      }
      else if (mVar6 == ma_device_type_capture) {
        uVar12 = (pDevice->capture).internalPeriodSizeInFrames;
        iVar2 = (&DAT_001158a0)[(pDevice->capture).internalFormat];
        mVar1 = (pDevice->capture).internalChannels;
        iVar11 = 0;
        if (uVar12 != 0) {
          uVar10 = 0;
          do {
            uVar7 = (uint)(0x1000 / (ulong)(iVar2 * mVar1));
            uVar9 = uVar12 - uVar10;
            if (uVar7 <= uVar12 - uVar10) {
              uVar9 = uVar7;
            }
            mVar5 = ma_device_read__pulse(pDevice,local_2038,uVar9,local_3038);
            if (mVar5 != 0) goto LAB_0010e07d;
            ma_device__send_frames_to_client(pDevice,local_3038[0],local_2038);
            uVar10 = uVar10 + local_3038[0];
          } while (uVar10 < uVar12);
          goto LAB_0010e072;
        }
      }
      else if (mVar6 == ma_device_type_duplex) {
        uVar12 = (pDevice->capture).internalPeriodSizeInFrames;
        uVar10 = (pDevice->playback).internalPeriodSizeInFrames;
        if (uVar12 < uVar10) {
          uVar10 = uVar12;
        }
        iVar11 = 0;
        if (uVar10 != 0) {
          iVar11 = 0;
          uVar12 = 0;
          do {
            mVar1 = (pDevice->playback).internalChannels;
            iVar2 = (&DAT_001158a0)[(pDevice->playback).internalFormat];
            uVar7 = (uint)(0x1000 / (ulong)((&DAT_001158a0)[(pDevice->capture).internalFormat] *
                                           (pDevice->capture).internalChannels));
            uVar9 = uVar10 - uVar12;
            if (uVar7 <= uVar10 - uVar12) {
              uVar9 = uVar7;
            }
            local_4070 = iVar11;
            mVar5 = ma_device_read__pulse(pDevice,local_2038,uVar9,&local_4054);
            if (mVar5 != 0) goto LAB_0010e0a4;
            local_4084 = 0;
            uVar3 = 0x1000 / (ulong)(iVar2 * mVar1);
            local_406c = local_4054;
            while( true ) {
              uVar4 = 0x1000 / (ulong)((&DAT_001158a0)[(pDevice->capture).format] *
                                      (pDevice->capture).channels);
              local_4078 = 0x1000 / (ulong)((&DAT_001158a0)[(pDevice->playback).format] *
                                           (pDevice->playback).channels);
              if ((uint)uVar4 < (uint)local_4078) {
                local_4078 = uVar4;
              }
              local_4048 = (ulong)local_406c;
              mVar5 = ma_data_converter_process_pcm_frames
                                (local_4040,
                                 local_2038 +
                                 (pDevice->capture).internalChannels * local_4084 *
                                 (&DAT_001158a0)[(pDevice->capture).internalFormat],&local_4048,
                                 local_1038,&local_4078);
              iVar11 = local_4070;
              if (mVar5 != 0) goto LAB_0010df38;
              if (local_4078 == 0) {
                mVar5 = 0;
                goto LAB_0010df38;
              }
              ma_device__on_data(pDevice,local_4038,local_1038,(ma_uint32)local_4078);
              iVar2 = (int)local_4048;
              local_4084 = local_4084 + (int)local_4048;
              local_4060 = local_4078;
              local_4068 = uVar3;
              mVar5 = ma_data_converter_process_pcm_frames
                                (local_4050,local_4038,&local_4060,local_3038,&local_4068);
              if (mVar5 != 0) break;
              local_406c = local_406c - iVar2;
              while( true ) {
                mVar5 = ma_device_write__pulse
                                  (pDevice,local_3038,(ma_uint32)local_4068,(ma_uint32 *)0x0);
                if (mVar5 != 0) goto LAB_0010df33;
                local_4078 = local_4078 - (local_4060 & 0xffffffff);
                if (local_4078 == 0) break;
                local_4068 = uVar3;
                local_4060 = local_4078;
                mVar5 = ma_data_converter_process_pcm_frames
                                  (local_4050,local_4038,&local_4060,local_3038,&local_4068);
                if (mVar5 != 0) goto LAB_0010df33;
              }
            }
LAB_0010df33:
            iVar11 = 1;
LAB_0010df38:
            uVar12 = uVar12 + local_4084;
          } while (uVar12 < uVar10);
        }
      }
      else {
        iVar11 = 0;
      }
      goto LAB_0010e08a;
    }
LAB_0010e0a4:
    mVar6 = pDevice->type;
    if ((mVar6 & ~ma_device_type_playback) == ma_device_type_capture) {
      mVar8 = ma_device__cork_stream__pulse(pDevice,ma_device_type_capture,1);
      if (mVar8 != 0) {
        return mVar5;
      }
      mVar6 = pDevice->type;
    }
    if ((mVar6 | ma_device_type_capture) == ma_device_type_duplex) {
      pOP = (ma_pa_operation *)
            (*(pDevice->pContext->field_21).alsa.snd_pcm_state)
                      ((pDevice->field_23).pulse.pStreamPlayback,
                       ma_pulse_operation_complete_callback,local_2038);
      if (pOP != (ma_pa_operation *)0x0) {
        ma_wait_for_operation__pulse
                  (pDevice->pContext,
                   (ma_pa_mainloop *)(pDevice->field_23).null_device.deviceThread.pContext,pOP);
        (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pOP);
      }
      ma_device__cork_stream__pulse(pDevice,ma_device_type_playback,1);
    }
  }
  return mVar5;
LAB_0010e07d:
  iVar11 = 1;
LAB_0010e08a:
  if ((pDevice->state != 2) || (iVar11 != 0)) goto LAB_0010e0a4;
  goto LAB_0010dcf6;
}

Assistant:

static ma_result ma_device_main_loop__pulse(ma_device* pDevice)
{
    ma_result result = MA_SUCCESS;
    ma_bool32 exitLoop = MA_FALSE;

    MA_ASSERT(pDevice != NULL);

    /* The stream needs to be uncorked first. We do this at the top for both capture and playback for PulseAudio. */
    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        result = ma_device__cork_stream__pulse(pDevice, ma_device_type_capture, 0);
        if (result != MA_SUCCESS) {
            return result;
        }
    }
    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        result = ma_device__cork_stream__pulse(pDevice, ma_device_type_playback, 0);
        if (result != MA_SUCCESS) {
            return result;
        }
    }


    while (ma_device__get_state(pDevice) == MA_STATE_STARTED && !exitLoop) {
        switch (pDevice->type)
        {
            case ma_device_type_duplex:
            {
                /* The process is: device_read -> convert -> callback -> convert -> device_write */
                ma_uint32 totalCapturedDeviceFramesProcessed = 0;
                ma_uint32 capturedDevicePeriodSizeInFrames = ma_min(pDevice->capture.internalPeriodSizeInFrames, pDevice->playback.internalPeriodSizeInFrames);
                    
                while (totalCapturedDeviceFramesProcessed < capturedDevicePeriodSizeInFrames) {
                    ma_uint8  capturedDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint8  playbackDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint32 capturedDeviceDataCapInFrames = sizeof(capturedDeviceData) / ma_get_bytes_per_frame(pDevice->capture.internalFormat,  pDevice->capture.internalChannels);
                    ma_uint32 playbackDeviceDataCapInFrames = sizeof(playbackDeviceData) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    ma_uint32 capturedDeviceFramesRemaining;
                    ma_uint32 capturedDeviceFramesProcessed;
                    ma_uint32 capturedDeviceFramesToProcess;
                    ma_uint32 capturedDeviceFramesToTryProcessing = capturedDevicePeriodSizeInFrames - totalCapturedDeviceFramesProcessed;
                    if (capturedDeviceFramesToTryProcessing > capturedDeviceDataCapInFrames) {
                        capturedDeviceFramesToTryProcessing = capturedDeviceDataCapInFrames;
                    }

                    result = ma_device_read__pulse(pDevice, capturedDeviceData, capturedDeviceFramesToTryProcessing, &capturedDeviceFramesToProcess);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    capturedDeviceFramesRemaining = capturedDeviceFramesToProcess;
                    capturedDeviceFramesProcessed = 0;

                    for (;;) {
                        ma_uint8  capturedClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint8  playbackClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint32 capturedClientDataCapInFrames = sizeof(capturedClientData) / ma_get_bytes_per_frame(pDevice->capture.format, pDevice->capture.channels);
                        ma_uint32 playbackClientDataCapInFrames = sizeof(playbackClientData) / ma_get_bytes_per_frame(pDevice->playback.format, pDevice->playback.channels);
                        ma_uint64 capturedClientFramesToProcessThisIteration = ma_min(capturedClientDataCapInFrames, playbackClientDataCapInFrames);
                        ma_uint64 capturedDeviceFramesToProcessThisIteration = capturedDeviceFramesRemaining;
                        ma_uint8* pRunningCapturedDeviceFrames = ma_offset_ptr(capturedDeviceData, capturedDeviceFramesProcessed * ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels));

                        /* Convert capture data from device format to client format. */
                        result = ma_data_converter_process_pcm_frames(&pDevice->capture.converter, pRunningCapturedDeviceFrames, &capturedDeviceFramesToProcessThisIteration, capturedClientData, &capturedClientFramesToProcessThisIteration);
                        if (result != MA_SUCCESS) {
                            break;
                        }

                        /*
                        If we weren't able to generate any output frames it must mean we've exhaused all of our input. The only time this would not be the case is if capturedClientData was too small
                        which should never be the case when it's of the size MA_DATA_CONVERTER_STACK_BUFFER_SIZE.
                        */
                        if (capturedClientFramesToProcessThisIteration == 0) {
                            break;
                        }

                        ma_device__on_data(pDevice, playbackClientData, capturedClientData, (ma_uint32)capturedClientFramesToProcessThisIteration);    /* Safe cast .*/

                        capturedDeviceFramesProcessed += (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */
                        capturedDeviceFramesRemaining -= (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */

                        /* At this point the playbackClientData buffer should be holding data that needs to be written to the device. */
                        for (;;) {
                            ma_uint64 convertedClientFrameCount = capturedClientFramesToProcessThisIteration;
                            ma_uint64 convertedDeviceFrameCount = playbackDeviceDataCapInFrames;
                            result = ma_data_converter_process_pcm_frames(&pDevice->playback.converter, playbackClientData, &convertedClientFrameCount, playbackDeviceData, &convertedDeviceFrameCount);
                            if (result != MA_SUCCESS) {
                                break;
                            }

                            result = ma_device_write__pulse(pDevice, playbackDeviceData, (ma_uint32)convertedDeviceFrameCount, NULL);   /* Safe cast. */
                            if (result != MA_SUCCESS) {
                                exitLoop = MA_TRUE;
                                break;
                            }

                            capturedClientFramesToProcessThisIteration -= (ma_uint32)convertedClientFrameCount;  /* Safe cast. */
                            if (capturedClientFramesToProcessThisIteration == 0) {
                                break;
                            }
                        }

                        /* In case an error happened from ma_device_write__pulse()... */
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }
                    }

                    totalCapturedDeviceFramesProcessed += capturedDeviceFramesProcessed;
                }
            } break;

            case ma_device_type_capture:
            {
                ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
                ma_uint32 periodSizeInFrames = pDevice->capture.internalPeriodSizeInFrames;
                ma_uint32 framesReadThisPeriod = 0;
                while (framesReadThisPeriod < periodSizeInFrames) {
                    ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesReadThisPeriod;
                    ma_uint32 framesProcessed;
                    ma_uint32 framesToReadThisIteration = framesRemainingInPeriod;
                    if (framesToReadThisIteration > intermediaryBufferSizeInFrames) {
                        framesToReadThisIteration = intermediaryBufferSizeInFrames;
                    }

                    result = ma_device_read__pulse(pDevice, intermediaryBuffer, framesToReadThisIteration, &framesProcessed);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    ma_device__send_frames_to_client(pDevice, framesProcessed, intermediaryBuffer);

                    framesReadThisPeriod += framesProcessed;
                }
            } break;

            case ma_device_type_playback:
            {
                ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                ma_uint32 periodSizeInFrames = pDevice->playback.internalPeriodSizeInFrames;
                ma_uint32 framesWrittenThisPeriod = 0;
                while (framesWrittenThisPeriod < periodSizeInFrames) {
                    ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesWrittenThisPeriod;
                    ma_uint32 framesProcessed;
                    ma_uint32 framesToWriteThisIteration = framesRemainingInPeriod;
                    if (framesToWriteThisIteration > intermediaryBufferSizeInFrames) {
                        framesToWriteThisIteration = intermediaryBufferSizeInFrames;
                    }

                    ma_device__read_frames_from_client(pDevice, framesToWriteThisIteration, intermediaryBuffer);

                    result = ma_device_write__pulse(pDevice, intermediaryBuffer, framesToWriteThisIteration, &framesProcessed);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    framesWrittenThisPeriod += framesProcessed;
                }
            } break;

            /* To silence a warning. Will never hit this. */
            case ma_device_type_loopback:
            default: break;
        }
    }

    /* Here is where the device needs to be stopped. */
    ma_device_stop__pulse(pDevice);

    return result;
}